

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O3

void inlet_fwd(_inlet *x,t_symbol *s,int argc,t_atom *argv)

{
  t_pd *x_00;
  long lVar1;
  t_symbol *s_00;
  undefined8 uStack_40;
  t_atom tStack_38;
  undefined1 auStack_28 [8];
  
  lVar1 = (long)argc;
  (&tStack_38)[-lVar1].a_type = A_SYMBOL;
  *(t_symbol **)(auStack_28 + lVar1 * -0x10 + -8) = s;
  if (0 < argc) {
    (&uStack_40)[lVar1 * -2] = 0x16f377;
    memcpy(auStack_28 + lVar1 * -0x10,argv,(ulong)(uint)argc << 4);
  }
  x_00 = x->i_dest;
  (&uStack_40)[lVar1 * -2] = 0x16f387;
  s_00 = gensym("fwd");
  (&uStack_40)[lVar1 * -2] = 0x16f397;
  pd_typedmess(x_00,s_00,argc + 1,&tStack_38 + -lVar1);
  return;
}

Assistant:

static void inlet_fwd(t_inlet *x, t_symbol *s, int argc, t_atom *argv)
{
    t_atom *argvec = (t_atom *)alloca((argc+1) * sizeof(t_atom));
    int i;
    SETSYMBOL(argvec, s);
    for (i = 0; i < argc; i++)
        argvec[i+1] = argv[i];
    typedmess(x->i_dest, gensym("fwd"), argc+1, argvec);
}